

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void rand_pk(secp256k1_pubkey *pk)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uchar seckey [32];
  secp256k1_keypair keypair;
  uchar auStack_98 [40];
  secp256k1_keypair local_70;
  
  secp256k1_testrand256(auStack_98);
  iVar1 = secp256k1_keypair_create(CTX,&local_70,auStack_98);
  if (iVar1 == 0) {
    pcVar3 = "test condition failed: secp256k1_keypair_create(CTX, &keypair, seckey) == 1";
    uVar2 = 0x294;
  }
  else {
    iVar1 = secp256k1_keypair_pub(CTX,pk,&local_70);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = "test condition failed: secp256k1_keypair_pub(CTX, pk, &keypair) == 1";
    uVar2 = 0x295;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void rand_pk(secp256k1_pubkey *pk) {
    unsigned char seckey[32];
    secp256k1_keypair keypair;
    secp256k1_testrand256(seckey);
    CHECK(secp256k1_keypair_create(CTX, &keypair, seckey) == 1);
    CHECK(secp256k1_keypair_pub(CTX, pk, &keypair) == 1);
}